

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O0

uint64_t sylvan_skiplist_get(sylvan_skiplist_t l,MTBDD dd)

{
  uint uVar1;
  uint32_t loc_next;
  sl_bucket *e;
  uint32_t k;
  uint32_t loc;
  MTBDD dd_local;
  sylvan_skiplist_t l_local;
  
  if ((dd != 0) && (dd != 0x8000000000000000)) {
    e._4_4_ = 0;
    e._0_4_ = 0xd;
    uVar1 = e._4_4_;
    while( true ) {
      do {
        e._4_4_ = uVar1;
        uVar1 = l->buckets[e._4_4_].next[(uint)e] & 0x7fffffff;
        if ((uVar1 != 0) && (l->buckets[uVar1].dd == dd)) {
          return (ulong)uVar1;
        }
      } while ((uVar1 != 0) && (l->buckets[uVar1].dd < dd));
      if ((uint)e == 0) break;
      e._0_4_ = (uint)e - 1;
      uVar1 = e._4_4_;
    }
  }
  return 0;
}

Assistant:

uint64_t
sylvan_skiplist_get(sylvan_skiplist_t l, MTBDD dd)
{
    if (dd == mtbdd_false || dd == mtbdd_true) return 0;

    uint32_t loc = 0, k = SL_DEPTH-1;
    for (;;) {
        /* invariant: [loc].dd < dd */
        /* note: this is always true for loc==0 */
        sl_bucket *e = l->buckets + loc;
        uint32_t loc_next = atomic_load_explicit(e->next+k, memory_order_acquire) & 0x7fffffff;
        if (loc_next != 0 && l->buckets[loc_next].dd == dd) {
            /* found */
            return loc_next;
        } else if (loc_next != 0 && l->buckets[loc_next].dd < dd) {
            /* go right */
            loc = loc_next;
        } else if (k > 0) {
            /* go down */
            k--;
        } else {
            return 0;
        }
    }
}